

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O2

void __thiscall
NaConfigFile::NaConfigFile
          (NaConfigFile *this,char *szMagic,uint nMajorVerNo,uint nMinorVerNo,char *szFileExt,
          char *szMarks)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 *puVar4;
  
  (this->super_NaDataStream)._vptr_NaDataStream = (_func_int **)&PTR__NaConfigFile_00173ec0;
  NaDataStream::NaDataStream(&this->super_NaDataStream,this->nFileVer);
  (this->super_NaDataStream)._vptr_NaDataStream = (_func_int **)&PTR__NaConfigFile_00173ec0;
  this->nPartList = 0;
  this->pPartList = (NaConfigPart **)0x0;
  (this->arReg)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00173f28;
  (this->arReg).nItems = 0;
  this->fp = (FILE *)0x0;
  (this->arReg).pHead = (item *)0x0;
  (this->arReg).pTail = (item *)0x0;
  if (((szMagic != (char *)0x0) && (szFileExt != (char *)0x0)) && (szMarks != (char *)0x0)) {
    sVar1 = strlen(szMagic);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    this->szMagicString = pcVar2;
    strcpy(pcVar2,szMagic);
    sVar1 = strlen(szFileExt);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    this->szFileExtString = pcVar2;
    strcpy(pcVar2,szFileExt);
    sVar1 = strlen(szMarks);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    this->szMarksBuf = pcVar2;
    strcpy(pcVar2,szMarks);
    this->szTitleStartMark = pcVar2;
    pcVar2 = strchr(pcVar2,0x20);
    this->szTitleEndMark = pcVar2 + 1;
    pcVar3 = strchr(pcVar2 + 1,0x20);
    this->szCommentMark = pcVar3 + 1;
    *pcVar2 = '\0';
    this->szCommentMark[-1] = '\0';
    this->nVer[0] = nMajorVerNo;
    this->nFileVer[0] = nMajorVerNo;
    this->nVer[1] = nMinorVerNo;
    this->nFileVer[1] = nMinorVerNo;
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

NaConfigFile::NaConfigFile (const char* szMagic,
                            unsigned nMajorVerNo,
                            unsigned nMinorVerNo,
                            const char* szFileExt,
                            const char* szMarks)
: NaDataStream(nFileVer), nPartList(0), pPartList(NULL), fp(NULL)
{
    if(NULL == szMagic || NULL == szFileExt || NULL == szMarks)
        throw(na_null_pointer);

    szMagicString = new char[strlen(szMagic) + 1];
    strcpy(szMagicString, szMagic);

    szFileExtString = new char[strlen(szFileExt) + 1];
    strcpy(szFileExtString, szFileExt);

    szMarksBuf = new char[strlen(szMarks) + 1];
    strcpy(szMarksBuf, szMarks);

    szTitleStartMark = szMarksBuf;
    szTitleEndMark = 1 + strchr(szTitleStartMark, ' ');
    szCommentMark = 1 + strchr(szTitleEndMark, ' ');

    szTitleEndMark[-1] = '\0';
    szCommentMark[-1] = '\0';

    nFileVer[NaMajorVerNo] = nVer[NaMajorVerNo] = nMajorVerNo;
    nFileVer[NaMinorVerNo] = nVer[NaMinorVerNo] = nMinorVerNo;
}